

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_fastcgi_module.c
# Opt level: O0

ngx_int_t ngx_http_fastcgi_process_record(ngx_http_request_t *r,ngx_http_fastcgi_ctx_t *f)

{
  byte bVar1;
  ngx_http_fastcgi_state_e local_34;
  byte *pbStack_30;
  ngx_http_fastcgi_state_e state;
  u_char *p;
  u_char ch;
  ngx_http_fastcgi_ctx_t *f_local;
  ngx_http_request_t *r_local;
  
  local_34 = f->state;
  pbStack_30 = f->pos;
  do {
    if (f->last <= pbStack_30) {
      f->state = local_34;
      return -2;
    }
    bVar1 = *pbStack_30;
    if ((r->connection->log->log_level & 0x100) != 0) {
      ngx_log_error_core(8,r->connection->log,0,"http fastcgi record byte: %02Xd",(ulong)bVar1);
    }
    switch(local_34) {
    case ngx_http_fastcgi_st_version:
      if (bVar1 != 1) {
        if (3 < r->connection->log->log_level) {
          ngx_log_error_core(4,r->connection->log,0,
                             "upstream sent unsupported FastCGI protocol version: %d",(ulong)bVar1);
        }
        return -1;
      }
      local_34 = ngx_http_fastcgi_st_type;
      break;
    case ngx_http_fastcgi_st_type:
      if ((bVar1 != 3) && (bVar1 != 6 && bVar1 != 7)) {
        if (3 < r->connection->log->log_level) {
          ngx_log_error_core(4,r->connection->log,0,"upstream sent invalid FastCGI record type: %d",
                             (ulong)bVar1);
        }
        return -1;
      }
      f->type = (ulong)bVar1;
      local_34 = ngx_http_fastcgi_st_request_id_hi;
      break;
    case ngx_http_fastcgi_st_request_id_hi:
      if (bVar1 != 0) {
        if (3 < r->connection->log->log_level) {
          ngx_log_error_core(4,r->connection->log,0,
                             "upstream sent unexpected FastCGI request id high byte: %d",
                             (ulong)bVar1);
        }
        return -1;
      }
      local_34 = ngx_http_fastcgi_st_request_id_lo;
      break;
    case ngx_http_fastcgi_st_request_id_lo:
      if (bVar1 != 1) {
        if (3 < r->connection->log->log_level) {
          ngx_log_error_core(4,r->connection->log,0,
                             "upstream sent unexpected FastCGI request id low byte: %d",(ulong)bVar1
                            );
        }
        return -1;
      }
      local_34 = ngx_http_fastcgi_st_content_length_hi;
      break;
    case ngx_http_fastcgi_st_content_length_hi:
      f->length = (long)(int)((uint)bVar1 << 8);
      local_34 = ngx_http_fastcgi_st_content_length_lo;
      break;
    case ngx_http_fastcgi_st_content_length_lo:
      f->length = (ulong)bVar1 | f->length;
      local_34 = ngx_http_fastcgi_st_padding_length;
      break;
    case ngx_http_fastcgi_st_padding_length:
      f->padding = (ulong)bVar1;
      local_34 = ngx_http_fastcgi_st_reserved;
      break;
    case ngx_http_fastcgi_st_reserved:
      if ((r->connection->log->log_level & 0x100) != 0) {
        ngx_log_error_core(8,r->connection->log,0,"http fastcgi record length: %z",f->length);
      }
      f->pos = pbStack_30 + 1;
      f->state = ngx_http_fastcgi_st_data;
      return 0;
    case ngx_http_fastcgi_st_data:
    case ngx_http_fastcgi_st_padding:
    }
    pbStack_30 = pbStack_30 + 1;
  } while( true );
}

Assistant:

static ngx_int_t
ngx_http_fastcgi_process_record(ngx_http_request_t *r,
    ngx_http_fastcgi_ctx_t *f)
{
    u_char                     ch, *p;
    ngx_http_fastcgi_state_e   state;

    state = f->state;

    for (p = f->pos; p < f->last; p++) {

        ch = *p;

        ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                       "http fastcgi record byte: %02Xd", ch);

        switch (state) {

        case ngx_http_fastcgi_st_version:
            if (ch != 1) {
                ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                              "upstream sent unsupported FastCGI "
                              "protocol version: %d", ch);
                return NGX_ERROR;
            }
            state = ngx_http_fastcgi_st_type;
            break;

        case ngx_http_fastcgi_st_type:
            switch (ch) {
            case NGX_HTTP_FASTCGI_STDOUT:
            case NGX_HTTP_FASTCGI_STDERR:
            case NGX_HTTP_FASTCGI_END_REQUEST:
                f->type = (ngx_uint_t) ch;
                break;
            default:
                ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                              "upstream sent invalid FastCGI "
                              "record type: %d", ch);
                return NGX_ERROR;

            }
            state = ngx_http_fastcgi_st_request_id_hi;
            break;

        /* we support the single request per connection */

        case ngx_http_fastcgi_st_request_id_hi:
            if (ch != 0) {
                ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                              "upstream sent unexpected FastCGI "
                              "request id high byte: %d", ch);
                return NGX_ERROR;
            }
            state = ngx_http_fastcgi_st_request_id_lo;
            break;

        case ngx_http_fastcgi_st_request_id_lo:
            if (ch != 1) {
                ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                              "upstream sent unexpected FastCGI "
                              "request id low byte: %d", ch);
                return NGX_ERROR;
            }
            state = ngx_http_fastcgi_st_content_length_hi;
            break;

        case ngx_http_fastcgi_st_content_length_hi:
            f->length = ch << 8;
            state = ngx_http_fastcgi_st_content_length_lo;
            break;

        case ngx_http_fastcgi_st_content_length_lo:
            f->length |= (size_t) ch;
            state = ngx_http_fastcgi_st_padding_length;
            break;

        case ngx_http_fastcgi_st_padding_length:
            f->padding = (size_t) ch;
            state = ngx_http_fastcgi_st_reserved;
            break;

        case ngx_http_fastcgi_st_reserved:
            state = ngx_http_fastcgi_st_data;

            ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                           "http fastcgi record length: %z", f->length);

            f->pos = p + 1;
            f->state = state;

            return NGX_OK;

        /* suppress warning */
        case ngx_http_fastcgi_st_data:
        case ngx_http_fastcgi_st_padding:
            break;
        }
    }

    f->state = state;

    return NGX_AGAIN;
}